

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demandmodel.cpp
# Opt level: O3

double __thiscall
PowerDemandModel::findDemand(PowerDemandModel *this,Junction *junc,double p,double *dqdh)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double __x;
  double dVar4;
  
  dVar1 = (junc->super_Node).fullDemand;
  *dqdh = 0.0;
  dVar2 = dVar1;
  if (0.0 < dVar1) {
    dVar4 = junc->pFull - junc->pMin;
    if (0.0 < dVar4) {
      __x = (p - junc->pMin) / dVar4;
      dVar3 = 0.0;
      if (__x <= 0.0) {
        dVar2 = 0.0;
      }
      else {
        dVar2 = 1.0;
        if (__x < 1.0) {
          dVar2 = pow(__x,(this->super_DemandModel).expon);
          dVar3 = (((this->super_DemandModel).expon / dVar4) * dVar2) / __x;
        }
      }
      dVar2 = dVar2 * dVar1;
      *dqdh = dVar3 * dVar1;
    }
  }
  return dVar2;
}

Assistant:

double PowerDemandModel::findDemand(Junction* junc, double p, double& dqdh)
{
    // ... initialize demand and demand derivative

    double qFull = junc->fullDemand;
    double q = qFull;
    dqdh = 0.0;

    // ... check for positive demand and pressure range

    double pRange = junc->pFull - junc->pMin;
    if ( qFull > 0.0 && pRange > 0.0)
    {
        // ... find fraction of full pressure met (f)

      	double factor = 0.0;
        double f = (p - junc->pMin) / pRange;

        // ... apply power function

        if (f <= 0.0) factor = 0.0;
        else if (f >= 1.0) factor = 1.0;
        else
        {
            factor = pow(f, expon);
            dqdh = expon / pRange * factor / f;
        }

        // ... update total demand and its derivative

        q = qFull * factor;
        dqdh = qFull * dqdh;
    }
    return q;
}